

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall
Memory::Recycler::PrintHeapBlockStats(Recycler *this,char16 *name,HeapBlockType type)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  undefined1 auVar9 [16];
  size_t liveCount;
  HeapBlockType type_local;
  char16 *name_local;
  Recycler *this_local;
  
  lVar3 = (this->collectionStats).heapBlockCount[type] -
          (this->collectionStats).heapBlockFreeCount[type];
  sVar1 = (this->collectionStats).heapBlockCount[type];
  sVar2 = (this->collectionStats).heapBlockFreeCount[type];
  auVar4._8_4_ = (int)(sVar2 >> 0x20);
  auVar4._0_8_ = sVar2;
  auVar4._12_4_ = DAT_0175a190._4_4_;
  auVar5._8_4_ = (int)(sVar1 >> 0x20);
  auVar5._0_8_ = sVar1;
  auVar5._12_4_ = DAT_0175a190._4_4_;
  Output::Print(L" %6s : %5d %5d %5d %5.1f",
                (((auVar4._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44((int)DAT_0175a190,(int)sVar2) - 4503599627370496.0)) /
                ((auVar5._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44((int)DAT_0175a190,(int)sVar1) - 4503599627370496.0))) * 100.0,name
                ,lVar3);
  if (type < LargeBlockType) {
    sVar1 = (this->collectionStats).heapBlockConcurrentSweptCount[type];
    sVar2 = (this->collectionStats).heapBlockSweptCount[type];
    auVar9._8_4_ = (int)(sVar2 >> 0x20);
    auVar9._0_8_ = sVar2;
    auVar9._12_4_ = 0x45300000;
    dVar8 = (auVar9._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0);
    auVar6._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar6._0_8_ = lVar3;
    auVar6._12_4_ = 0x45300000;
    auVar7._8_4_ = (int)(sVar1 >> 0x20);
    auVar7._0_8_ = sVar1;
    auVar7._12_4_ = 0x45300000;
    Output::Print(L" : %5d %6.1f : %5d %6.1f",
                  (dVar8 / ((auVar6._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0))) * 100.0,
                  (((auVar7._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) / dVar8) * 100.0)
    ;
  }
  return;
}

Assistant:

void
Recycler::PrintHeapBlockStats(char16 const * name, HeapBlock::HeapBlockType type)
{
    size_t liveCount = collectionStats.heapBlockCount[type] - collectionStats.heapBlockFreeCount[type];

    Output::Print(_u(" %6s : %5d %5d %5d %5.1f"), name,
        liveCount, collectionStats.heapBlockFreeCount[type], collectionStats.heapBlockCount[type],
        (double)collectionStats.heapBlockFreeCount[type] / (double)collectionStats.heapBlockCount[type] * 100);

    if (type < HeapBlock::SmallBlockTypeCount)
    {
        Output::Print(_u(" : %5d %6.1f : %5d %6.1f"),
            collectionStats.heapBlockSweptCount[type],
            (double)collectionStats.heapBlockSweptCount[type] / (double)liveCount * 100,
            collectionStats.heapBlockConcurrentSweptCount[type],
            (double)collectionStats.heapBlockConcurrentSweptCount[type] / (double)collectionStats.heapBlockSweptCount[type] * 100);
    }
}